

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

real __thiscall
fasttext::OneVsAllLoss::forward
          (OneVsAllLoss *this,vector<int,_std::allocator<int>_> *targets,int32_t param_2,
          State *state,real lr,bool backprop)

{
  size_t sVar1;
  bool labelIsPositive;
  float fVar2;
  real rVar3;
  int32_t local_38;
  real local_34;
  
  sVar1 = (state->output).data_.size_;
  fVar2 = 0.0;
  local_38 = 0;
  local_34 = lr;
  while( true ) {
    if ((int)sVar1 <= local_38) break;
    labelIsPositive = utils::contains<int>(targets,&local_38);
    rVar3 = BinaryLogisticLoss::binaryLogistic
                      (&this->super_BinaryLogisticLoss,local_38,state,labelIsPositive,local_34,
                       backprop);
    local_38 = local_38 + 1;
    fVar2 = fVar2 + rVar3;
  }
  return fVar2;
}

Assistant:

real OneVsAllLoss::forward(
    const std::vector<int32_t>& targets,
    int32_t /* we take all targets here */,
    Model::State& state,
    real lr,
    bool backprop) {
  real loss = 0.0;
  int32_t osz = state.output.size();
  for (int32_t i = 0; i < osz; i++) {
    bool isMatch = utils::contains(targets, i);
    loss += binaryLogistic(i, state, isMatch, lr, backprop);
  }

  return loss;
}